

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::initSubcycle(Amr *this)

{
  string *__lhs;
  pointer piVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *os_;
  int i;
  long lVar5;
  char *msg;
  int i_2;
  int i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_228;
  ParmParse pp;
  int nosub;
  MPI_Comm MStack_1ac;
  ostream local_1a0 [376];
  
  std::__cxx11::string::string((string *)&nosub,"amr",(allocator *)&bStack_228);
  ParmParse::ParmParse(&pp,(string *)&nosub);
  std::__cxx11::string::~string((string *)&nosub);
  this->sub_cycle = 1;
  bVar2 = ParmParse::contains(&pp,"nosub");
  if (bVar2) {
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose != 0) {
      os_ = OutStream();
      Print::Print((Print *)&nosub,os_);
      std::operator<<(local_1a0,"Warning: The nosub flag has been deprecated.\n ");
      std::operator<<(local_1a0,"... please use subcycling_mode to control subcycling.\n");
      Print::~Print((Print *)&nosub);
    }
    ParmParse::query(&pp,"nosub",&nosub,0);
    if (nosub < 1) {
      Error_host("nosub <= 0 not allowed.\n");
    }
    else {
      this->sub_cycle = 0;
    }
    std::__cxx11::string::assign((char *)&this->subcycling_mode);
  }
  else {
    std::__cxx11::string::assign((char *)&this->subcycling_mode);
    ParmParse::queryAdd(&pp,"subcycling_mode",&this->subcycling_mode);
  }
  __lhs = &this->subcycling_mode;
  bVar2 = std::operator==(__lhs,"None");
  if (bVar2) {
    this->sub_cycle = 0;
    piVar1 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    for (lVar5 = 0; lVar5 <= (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar5 = lVar5 + 1) {
      piVar1[lVar5] = 1;
    }
    goto LAB_00567341;
  }
  bVar2 = std::operator==(__lhs,"Manual");
  if (!bVar2) {
    bVar2 = std::operator==(__lhs,"Auto");
    if (bVar2) {
      *(this->n_cycle).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
      for (lVar5 = 1; lVar5 <= (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
          lVar5 = lVar5 + 1) {
        iVar3 = AmrMesh::MaxRefRatio((AmrMesh *)this,(int)lVar5 + -1);
        (this->n_cycle).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar5] = iVar3;
      }
    }
    else {
      bVar2 = std::operator==(__lhs,"Optimal");
      if (bVar2) {
        *(this->n_cycle).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
        for (lVar5 = 1; lVar5 <= (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
            lVar5 = lVar5 + 1) {
          iVar3 = AmrMesh::MaxRefRatio((AmrMesh *)this,(int)lVar5 + -1);
          (this->n_cycle).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar5] = iVar3;
        }
      }
      else {
        std::operator+(&bStack_228,"Unrecognzied subcycling mode: ",__lhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nosub,
                       &bStack_228,"\n");
        std::__cxx11::string::~string((string *)&bStack_228);
        Error_host((char *)CONCAT44(MStack_1ac,nosub));
        std::__cxx11::string::~string((string *)&nosub);
      }
    }
    goto LAB_00567341;
  }
  iVar3 = ParmParse::countval(&pp,"subcycling_iterations",-1);
  if (iVar3 == 1) {
    nosub = 0;
    ParmParse::get(&pp,"subcycling_iterations",&nosub,0);
    piVar1 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    *piVar1 = 1;
    for (lVar5 = 1; lVar5 <= (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        lVar5 = lVar5 + 1) {
      piVar1[lVar5] = nosub;
    }
  }
  else {
    if (iVar3 < 2) {
      msg = "Must provide a valid subcycling_iterations if mode is Manual";
    }
    else {
      ParmParse::getarr(&pp,"subcycling_iterations",
                        &(this->n_cycle).super_vector<int,_std::allocator<int>_>,0,
                        (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1);
      if (*(this->n_cycle).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
          1) goto LAB_00567367;
      msg = "First entry of subcycling_iterations must be 1";
    }
    Error_host(msg);
  }
LAB_00567367:
  for (lVar5 = 1; lVar5 <= (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      lVar5 = lVar5 + 1) {
    iVar3 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar5];
    iVar4 = AmrMesh::MaxRefRatio((AmrMesh *)this,(int)lVar5 + -1);
    if (iVar4 < iVar3) {
      Error_host("subcycling iterations must always be <= ref_ratio");
    }
    if ((this->n_cycle).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar5] < 1) {
      Error_host("subcycling iterations must always be > 0");
    }
  }
LAB_00567341:
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&pp);
  return;
}

Assistant:

void
Amr::initSubcycle ()
{
    BL_PROFILE("Amr::initSubcycle()");
    ParmParse pp("amr");
    sub_cycle = true;
    if (pp.contains("nosub"))
    {
        if (verbose) {
            amrex::Print() << "Warning: The nosub flag has been deprecated.\n "
                           << "... please use subcycling_mode to control subcycling.\n";
        }
        int nosub;
        pp.query("nosub",nosub);
        if (nosub > 0)
            sub_cycle = false;
        else
            amrex::Error("nosub <= 0 not allowed.\n");
        subcycling_mode = "None";
    }
    else
    {
        subcycling_mode = "Auto";
        pp.queryAdd("subcycling_mode",subcycling_mode);
    }

    if (subcycling_mode == "None")
    {
        sub_cycle = false;
        for (int i = 0; i <= max_level; i++)
        {
            n_cycle[i] = 1;
        }
    }
    else if (subcycling_mode == "Manual")
    {
        int cnt = pp.countval("subcycling_iterations");

        if (cnt == 1)
        {
            //
            // Set all values to the single available value.
            //
            int cycles = 0;

            pp.get("subcycling_iterations",cycles);

            n_cycle[0] = 1; // coarse level is always 1 cycle
            for (int i = 1; i <= max_level; i++)
            {
                n_cycle[i] = cycles;
            }
        }
        else if (cnt > 1)
        {
            //
            // Otherwise we expect a vector of max_grid_size values.
            //
            pp.getarr("subcycling_iterations",n_cycle,0,max_level+1);
            if (n_cycle[0] != 1)
            {
                amrex::Error("First entry of subcycling_iterations must be 1");
            }
        }
        else
        {
            amrex::Error("Must provide a valid subcycling_iterations if mode is Manual");
        }
        for (int i = 1; i <= max_level; i++)
        {
            if (n_cycle[i] > MaxRefRatio(i-1))
                amrex::Error("subcycling iterations must always be <= ref_ratio");
            if (n_cycle[i] <= 0)
                amrex::Error("subcycling iterations must always be > 0");
        }
    }
    else if (subcycling_mode == "Auto")
    {
        n_cycle[0] = 1;
        for (int i = 1; i <= max_level; i++)
        {
            n_cycle[i] = MaxRefRatio(i-1);
        }
    }
    else if (subcycling_mode == "Optimal")
    {
        // if subcycling mode is Optimal, n_cycle is set dynamically.
        // We'll initialize it to be Auto subcycling.
        n_cycle[0] = 1;
        for (int i = 1; i <= max_level; i++)
        {
            n_cycle[i] = MaxRefRatio(i-1);
        }
    }
    else
    {
        std::string err_message = "Unrecognzied subcycling mode: " + subcycling_mode + "\n";
        amrex::Error(err_message.c_str());
    }
}